

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpFileInfo.c
# Opt level: O0

UpnpFileInfo * UpnpFileInfo_new(void)

{
  UpnpString *pUVar1;
  s_UpnpFileInfo *p;
  
  p = (s_UpnpFileInfo *)calloc(1,0xb8);
  if (p == (s_UpnpFileInfo *)0x0) {
    p = (s_UpnpFileInfo *)0x0;
  }
  else {
    UpnpListInit(&p->m_ExtraHeadersList);
    pUVar1 = UpnpString_new();
    p->m_Os = pUVar1;
  }
  return p;
}

Assistant:

UpnpFileInfo *UpnpFileInfo_new(void)
{
	struct s_UpnpFileInfo *p = calloc(1, sizeof(struct s_UpnpFileInfo));

	if (!p)
		return 0;

	/*p->m_FileLength = 0;*/
	/*p->m_LastModified = 0;*/
	/*p->m_IsDirectory = 0;*/
	/*p->m_IsReadable = 0;*/
	/*p->m_ContentType = 0;*/
	UpnpListInit(&p->m_ExtraHeadersList);
	/* memset(&p->m_CtrlPtIPAddr, 0, sizeof (struct sockaddr_storage)); */
	p->m_Os = UpnpString_new();

	return (UpnpFileInfo *)p;
}